

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

int find_nearby_colors(j_decompress_ptr cinfo,int minc0,int minc1,int minc2,JSAMPLE *colorlist)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  JLONG tdist;
  JLONG max_dist;
  JLONG min_dist;
  JLONG minmaxdist;
  int ncolors;
  int x;
  int i;
  int centerc2;
  int centerc1;
  int centerc0;
  int maxc2;
  int maxc1;
  int maxc0;
  int numcolors;
  long alStack_868 [256];
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  int local_48;
  uint local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  long local_20;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_24 = *(int *)(in_RDI + 0x9c);
  local_28 = in_ESI + 0x18;
  local_34 = in_ESI + in_ESI + 0x18 >> 1;
  local_2c = in_EDX + 0x1c;
  local_38 = in_EDX + in_EDX + 0x1c >> 1;
  local_30 = in_ECX + 0x18;
  local_3c = in_ECX + in_ECX + 0x18 >> 1;
  local_50 = 0x7fffffff;
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_40 = 0; local_40 < local_24; local_40 = local_40 + 1) {
    uVar2 = (uint)*(byte *)(**(long **)(local_8 + 0xa0) + (long)local_40);
    if ((int)uVar2 < local_c) {
      lVar3 = (long)(int)((uVar2 - local_c) * c_scales[rgb_red[*(uint *)(local_8 + 0x40)]]);
      local_58 = lVar3 * lVar3;
      local_60 = (long)(int)((uVar2 - local_28) * c_scales[rgb_red[*(uint *)(local_8 + 0x40)]]);
      local_60 = local_60 * local_60;
    }
    else if (local_28 < (int)uVar2) {
      lVar3 = (long)(int)((uVar2 - local_28) * c_scales[rgb_red[*(uint *)(local_8 + 0x40)]]);
      local_58 = lVar3 * lVar3;
      local_60 = (long)(int)((uVar2 - local_c) * c_scales[rgb_red[*(uint *)(local_8 + 0x40)]]);
      local_60 = local_60 * local_60;
    }
    else {
      local_58 = 0;
      if (local_34 < (int)uVar2) {
        local_60 = (long)(int)((uVar2 - local_c) * c_scales[rgb_red[*(uint *)(local_8 + 0x40)]]);
        local_60 = local_60 * local_60;
      }
      else {
        local_60 = (long)(int)((uVar2 - local_28) * c_scales[rgb_red[*(uint *)(local_8 + 0x40)]]);
        local_60 = local_60 * local_60;
      }
    }
    uVar2 = (uint)*(byte *)(*(long *)(*(long *)(local_8 + 0xa0) + 8) + (long)local_40);
    if ((int)uVar2 < local_10) {
      lVar3 = (long)(int)((uVar2 - local_10) * c_scales[rgb_green[*(uint *)(local_8 + 0x40)]]);
      local_58 = lVar3 * lVar3 + local_58;
      lVar3 = (long)(int)((uVar2 - local_2c) * c_scales[rgb_green[*(uint *)(local_8 + 0x40)]]);
      lVar3 = lVar3 * lVar3;
    }
    else if (local_2c < (int)uVar2) {
      lVar3 = (long)(int)((uVar2 - local_2c) * c_scales[rgb_green[*(uint *)(local_8 + 0x40)]]);
      local_58 = lVar3 * lVar3 + local_58;
      lVar3 = (long)(int)((uVar2 - local_10) * c_scales[rgb_green[*(uint *)(local_8 + 0x40)]]);
      lVar3 = lVar3 * lVar3;
    }
    else if (local_38 < (int)uVar2) {
      lVar3 = (long)(int)((uVar2 - local_10) * c_scales[rgb_green[*(uint *)(local_8 + 0x40)]]);
      lVar3 = lVar3 * lVar3;
    }
    else {
      lVar3 = (long)(int)((uVar2 - local_2c) * c_scales[rgb_green[*(uint *)(local_8 + 0x40)]]);
      lVar3 = lVar3 * lVar3;
    }
    local_60 = lVar3 + local_60;
    local_44 = (uint)*(byte *)(*(long *)(*(long *)(local_8 + 0xa0) + 0x10) + (long)local_40);
    if ((int)local_44 < local_14) {
      lVar3 = (long)(int)((local_44 - local_14) * c_scales[rgb_blue[*(uint *)(local_8 + 0x40)]]);
      local_58 = lVar3 * lVar3 + local_58;
      local_68 = (long)(int)((local_44 - local_30) * c_scales[rgb_blue[*(uint *)(local_8 + 0x40)]]);
      local_60 = local_68 * local_68 + local_60;
    }
    else if (local_30 < (int)local_44) {
      lVar3 = (long)(int)((local_44 - local_30) * c_scales[rgb_blue[*(uint *)(local_8 + 0x40)]]);
      local_58 = lVar3 * lVar3 + local_58;
      local_68 = (long)(int)((local_44 - local_14) * c_scales[rgb_blue[*(uint *)(local_8 + 0x40)]]);
      local_60 = local_68 * local_68 + local_60;
    }
    else if (local_3c < (int)local_44) {
      local_68 = (long)(int)((local_44 - local_14) * c_scales[rgb_blue[*(uint *)(local_8 + 0x40)]]);
      local_60 = local_68 * local_68 + local_60;
    }
    else {
      local_68 = (long)(int)((local_44 - local_30) * c_scales[rgb_blue[*(uint *)(local_8 + 0x40)]]);
      local_60 = local_68 * local_68 + local_60;
    }
    alStack_868[local_40] = local_58;
    if (local_60 < local_50) {
      local_50 = local_60;
    }
  }
  local_48 = 0;
  for (local_40 = 0; iVar1 = local_48, local_40 < local_24; local_40 = local_40 + 1) {
    if (alStack_868[local_40] <= local_50) {
      local_48 = local_48 + 1;
      *(char *)(local_20 + iVar1) = (char)local_40;
    }
  }
  return local_48;
}

Assistant:

LOCAL(int)
find_nearby_colors(j_decompress_ptr cinfo, int minc0, int minc1, int minc2,
                   JSAMPLE colorlist[])
/* Locate the colormap entries close enough to an update box to be candidates
 * for the nearest entry to some cell(s) in the update box.  The update box
 * is specified by the center coordinates of its first cell.  The number of
 * candidate colormap entries is returned, and their colormap indexes are
 * placed in colorlist[].
 * This routine uses Heckbert's "locally sorted search" criterion to select
 * the colors that need further consideration.
 */
{
  int numcolors = cinfo->actual_number_of_colors;
  int maxc0, maxc1, maxc2;
  int centerc0, centerc1, centerc2;
  int i, x, ncolors;
  JLONG minmaxdist, min_dist, max_dist, tdist;
  JLONG mindist[MAXNUMCOLORS];  /* min distance to colormap entry i */

  /* Compute true coordinates of update box's upper corner and center.
   * Actually we compute the coordinates of the center of the upper-corner
   * histogram cell, which are the upper bounds of the volume we care about.
   * Note that since ">>" rounds down, the "center" values may be closer to
   * min than to max; hence comparisons to them must be "<=", not "<".
   */
  maxc0 = minc0 + ((1 << BOX_C0_SHIFT) - (1 << C0_SHIFT));
  centerc0 = (minc0 + maxc0) >> 1;
  maxc1 = minc1 + ((1 << BOX_C1_SHIFT) - (1 << C1_SHIFT));
  centerc1 = (minc1 + maxc1) >> 1;
  maxc2 = minc2 + ((1 << BOX_C2_SHIFT) - (1 << C2_SHIFT));
  centerc2 = (minc2 + maxc2) >> 1;

  /* For each color in colormap, find:
   *  1. its minimum squared-distance to any point in the update box
   *     (zero if color is within update box);
   *  2. its maximum squared-distance to any point in the update box.
   * Both of these can be found by considering only the corners of the box.
   * We save the minimum distance for each color in mindist[];
   * only the smallest maximum distance is of interest.
   */
  minmaxdist = 0x7FFFFFFFL;

  for (i = 0; i < numcolors; i++) {
    /* We compute the squared-c0-distance term, then add in the other two. */
    x = cinfo->colormap[0][i];
    if (x < minc0) {
      tdist = (x - minc0) * C0_SCALE;
      min_dist = tdist * tdist;
      tdist = (x - maxc0) * C0_SCALE;
      max_dist = tdist * tdist;
    } else if (x > maxc0) {
      tdist = (x - maxc0) * C0_SCALE;
      min_dist = tdist * tdist;
      tdist = (x - minc0) * C0_SCALE;
      max_dist = tdist * tdist;
    } else {
      /* within cell range so no contribution to min_dist */
      min_dist = 0;
      if (x <= centerc0) {
        tdist = (x - maxc0) * C0_SCALE;
        max_dist = tdist * tdist;
      } else {
        tdist = (x - minc0) * C0_SCALE;
        max_dist = tdist * tdist;
      }
    }

    x = cinfo->colormap[1][i];
    if (x < minc1) {
      tdist = (x - minc1) * C1_SCALE;
      min_dist += tdist * tdist;
      tdist = (x - maxc1) * C1_SCALE;
      max_dist += tdist * tdist;
    } else if (x > maxc1) {
      tdist = (x - maxc1) * C1_SCALE;
      min_dist += tdist * tdist;
      tdist = (x - minc1) * C1_SCALE;
      max_dist += tdist * tdist;
    } else {
      /* within cell range so no contribution to min_dist */
      if (x <= centerc1) {
        tdist = (x - maxc1) * C1_SCALE;
        max_dist += tdist * tdist;
      } else {
        tdist = (x - minc1) * C1_SCALE;
        max_dist += tdist * tdist;
      }
    }

    x = cinfo->colormap[2][i];
    if (x < minc2) {
      tdist = (x - minc2) * C2_SCALE;
      min_dist += tdist * tdist;
      tdist = (x - maxc2) * C2_SCALE;
      max_dist += tdist * tdist;
    } else if (x > maxc2) {
      tdist = (x - maxc2) * C2_SCALE;
      min_dist += tdist * tdist;
      tdist = (x - minc2) * C2_SCALE;
      max_dist += tdist * tdist;
    } else {
      /* within cell range so no contribution to min_dist */
      if (x <= centerc2) {
        tdist = (x - maxc2) * C2_SCALE;
        max_dist += tdist * tdist;
      } else {
        tdist = (x - minc2) * C2_SCALE;
        max_dist += tdist * tdist;
      }
    }

    mindist[i] = min_dist;      /* save away the results */
    if (max_dist < minmaxdist)
      minmaxdist = max_dist;
  }

  /* Now we know that no cell in the update box is more than minmaxdist
   * away from some colormap entry.  Therefore, only colors that are
   * within minmaxdist of some part of the box need be considered.
   */
  ncolors = 0;
  for (i = 0; i < numcolors; i++) {
    if (mindist[i] <= minmaxdist)
      colorlist[ncolors++] = (JSAMPLE)i;
  }
  return ncolors;
}